

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void shutdown_system_driver(void)

{
  _Bool _Var1;
  undefined8 in_RAX;
  ALLEGRO_PATH *unaff_retaddr;
  
  if (active_sysdrv != (ALLEGRO_SYSTEM *)0x0) {
    if (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0) {
      al_destroy_path(unaff_retaddr);
    }
    if ((active_sysdrv->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0) &&
       (active_sysdrv->vt->shutdown_system != (_func_void *)0x0)) {
      (*active_sysdrv->vt->shutdown_system)();
    }
    active_sysdrv = (ALLEGRO_SYSTEM *)0x0;
    while( true ) {
      _Var1 = _al_vector_is_empty(&_al_system_interfaces);
      if (((_Var1 ^ 0xffU) & 1) == 0) break;
      _al_vector_size(&_al_system_interfaces);
      _al_vector_delete_at((_AL_VECTOR *)unaff_retaddr,(uint)((ulong)in_RAX >> 0x20));
    }
    _al_vector_free((_AL_VECTOR *)0x17eb33);
    _al_vector_init(&_al_system_interfaces,8);
  }
  al_destroy_config((ALLEGRO_CONFIG *)unaff_retaddr);
  sys_config = (ALLEGRO_CONFIG *)0x0;
  return;
}

Assistant:

static void shutdown_system_driver(void)
{
   if (active_sysdrv) {
      if (active_sysdrv->user_exe_path)
         al_destroy_path(active_sysdrv->user_exe_path);
      if (active_sysdrv->vt && active_sysdrv->vt->shutdown_system)
         active_sysdrv->vt->shutdown_system();
      active_sysdrv = NULL;
 
      while (!_al_vector_is_empty(&_al_system_interfaces))
         _al_vector_delete_at(&_al_system_interfaces, _al_vector_size(&_al_system_interfaces)-1);
      _al_vector_free(&_al_system_interfaces);
      _al_vector_init(&_al_system_interfaces, sizeof(ALLEGRO_SYSTEM_INTERFACE *));
   }
   al_destroy_config(sys_config);
   sys_config = NULL;
}